

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::AdlChannel::addAge(AdlChannel *this,int64_t us)

{
  bool bVar1;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar2;
  long *plVar3;
  long local_40;
  LocationData *local_38;
  LocationData *d;
  users_iterator i;
  long local_20;
  int64_t neg;
  int64_t us_local;
  AdlChannel *this_local;
  
  local_20 = -0x7cfffffc18;
  neg = us;
  us_local = (int64_t)this;
  bVar1 = pl_list<MIDIplay::AdlChannel::LocationData>::empty(&this->users);
  if (bVar1) {
    i.cell_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)
              (this->koff_time_until_neglible_us - neg);
    plVar3 = std::max<long>((long *)&i,&local_20);
    this->koff_time_until_neglible_us = *plVar3;
    if (this->koff_time_until_neglible_us < 0) {
      this->koff_time_until_neglible_us = 0;
    }
  }
  else {
    this->koff_time_until_neglible_us = 0;
    d = (LocationData *)pl_list<MIDIplay::AdlChannel::LocationData>::begin(&this->users);
    while (bVar1 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::is_end
                             ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&d),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar2 = pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator->
                         ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&d);
      local_38 = &ppVar2->value;
      if (((ppVar2->value).fixed_sustain & 1U) == 0) {
        local_40 = (ppVar2->value).kon_time_until_neglible_us - neg;
        plVar3 = std::max<long>(&local_40,&local_20);
        local_38->kon_time_until_neglible_us = *plVar3;
      }
      local_38->vibdelay_us = neg + local_38->vibdelay_us;
      pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_>::operator++
                ((pl_iterator<pl_cell<MIDIplay::AdlChannel::LocationData>_> *)&d);
    }
  }
  return;
}

Assistant:

void MIDIplay::AdlChannel::addAge(int64_t us)
{
    const int64_t neg = 1000 * static_cast<int64_t>(-0x1FFFFFFFl);
    if(users.empty())
    {
        koff_time_until_neglible_us = std::max(koff_time_until_neglible_us - us, neg);
        if(koff_time_until_neglible_us < 0)
            koff_time_until_neglible_us = 0;
    }
    else
    {
        koff_time_until_neglible_us = 0;
        for(users_iterator i = users.begin(); !i.is_end(); ++i)
        {
            LocationData &d = i->value;
            if(!d.fixed_sustain)
                d.kon_time_until_neglible_us = std::max(d.kon_time_until_neglible_us - us, neg);
            d.vibdelay_us += us;
        }
    }
}